

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_parse.c
# Opt level: O1

MPP_RET parse_prepare_avcC_header(H264dInputCtx_t *p_Inp,H264dCurCtx_t *p_Cur)

{
  byte bVar1;
  RK_U8 *pRVar2;
  MppPacket pvVar3;
  RK_U8 *ptr;
  ushort uVar4;
  MPP_RET MVar5;
  ushort *puVar6;
  undefined8 uVar7;
  int iVar8;
  
  pRVar2 = p_Inp->in_buf;
  pvVar3 = p_Inp->in_pkt;
  ptr = (p_Cur->strm).nalu_buf;
  if (ptr != (RK_U8 *)0x0) {
    mpp_osal_free("parse_prepare_avcC_header",ptr);
  }
  (p_Cur->strm).nalu_buf = (RK_U8 *)0x0;
  if (p_Inp->in_length < 7) {
    MVar5 = MPP_ERR_UNKNOW;
    if (((byte)h264d_debug & 1) != 0) {
      _mpp_log_l(4,"h264d_parse","avcC too short, len=%d \n",(char *)0x0);
    }
  }
  else {
    MVar5 = MPP_ERR_UNKNOW;
    if (*pRVar2 == '\x01') {
      p_Inp->profile = pRVar2[1];
      p_Inp->level = pRVar2[3];
      p_Inp->nal_size = (pRVar2[4] & 3) + 1;
      bVar1 = pRVar2[5];
      puVar6 = (ushort *)(pRVar2 + 6);
      p_Inp->sps_num = bVar1 & 0x1f;
      if ((bVar1 & 0x1f) != 0) {
        iVar8 = 0;
        do {
          (p_Cur->strm).nalu_len = (uint)(ushort)(*puVar6 << 8 | *puVar6 >> 8);
          (p_Cur->strm).nalu_type = 7;
          (p_Cur->strm).nalu_buf = (RK_U8 *)(puVar6 + 1);
          MVar5 = store_cur_nalu(p_Cur,&p_Cur->strm,p_Cur->p_Dec->dxva_ctx);
          if (MVar5 < MPP_OK) {
            if (((byte)h264d_debug & 4) == 0) {
              return MVar5;
            }
            uVar7 = 0x35d;
            goto LAB_0018c6af;
          }
          puVar6 = (ushort *)((long)(puVar6 + 1) + (ulong)(p_Cur->strm).nalu_len);
          iVar8 = iVar8 + 1;
        } while (iVar8 < p_Inp->sps_num);
      }
      (p_Cur->strm).nalu_buf = (RK_U8 *)0x0;
      uVar4 = *puVar6;
      p_Inp->pps_num = (uint)(byte)uVar4;
      if ((byte)uVar4 != 0) {
        puVar6 = (ushort *)((long)puVar6 + 1);
        iVar8 = 0;
        do {
          (p_Cur->strm).nalu_len = (uint)(ushort)(*puVar6 << 8 | *puVar6 >> 8);
          (p_Cur->strm).nalu_type = 8;
          (p_Cur->strm).nalu_buf = (RK_U8 *)(puVar6 + 1);
          MVar5 = store_cur_nalu(p_Cur,&p_Cur->strm,p_Cur->p_Dec->dxva_ctx);
          if (MVar5 < MPP_OK) {
            if (((byte)h264d_debug & 4) == 0) {
              return MVar5;
            }
            uVar7 = 0x368;
LAB_0018c6af:
            _mpp_log_l(4,"h264d_parse","Function error(%d).\n",(char *)0x0,uVar7);
            return MVar5;
          }
          puVar6 = (ushort *)((long)(puVar6 + 1) + (ulong)(p_Cur->strm).nalu_len);
          iVar8 = iVar8 + 1;
        } while (iVar8 < p_Inp->pps_num);
      }
      MVar5 = MPP_OK;
      *(undefined8 *)((long)pvVar3 + 0x20) = 0;
      (p_Cur->strm).nalu_buf = (RK_U8 *)0x0;
      (p_Cur->strm).startcode_found = '\x01';
    }
  }
  return MVar5;
}

Assistant:

MPP_RET parse_prepare_avcC_header(H264dInputCtx_t *p_Inp, H264dCurCtx_t *p_Cur)
{
    RK_S32 i = 0;
    MPP_RET ret = MPP_ERR_UNKNOW;

    H264dCurStream_t *p_strm = &p_Cur->strm;
    RK_U8 *pdata = p_Inp->in_buf;
    MppPacketImpl *pkt_impl  = (MppPacketImpl *)p_Inp->in_pkt;

    //!< free nalu_buffer
    MPP_FREE(p_strm->nalu_buf);
    if (p_Inp->in_length < 7) {
        H264D_ERR("avcC too short, len=%d \n", p_Inp->in_length);
        goto __FAILED;
    }
    if (pdata[0] != 1) {
        goto __FAILED;
    }
    p_Inp->profile = pdata[1];
    p_Inp->level = pdata[3];
    p_Inp->nal_size = 1 + (pdata[4] & 3);
    p_Inp->sps_num = pdata[5] & 31;

    pdata += 6;
    for (i = 0; i < p_Inp->sps_num; ++i) {
        p_strm->nalu_len = U16_AT(pdata);
        pdata += 2;
        p_strm->nalu_type = H264_NALU_TYPE_SPS;
        p_strm->nalu_buf = pdata;
        FUN_CHECK(ret = store_cur_nalu(p_Cur, p_strm, p_Cur->p_Dec->dxva_ctx));
        pdata += p_strm->nalu_len;
    }
    p_strm->nalu_buf = NULL;
    p_Inp->pps_num = *pdata;
    ++pdata;
    for (i = 0; i < p_Inp->pps_num; ++i) {
        p_strm->nalu_len = U16_AT(pdata);
        pdata += 2;
        p_strm->nalu_type = H264_NALU_TYPE_PPS;
        p_strm->nalu_buf = pdata;
        FUN_CHECK(ret = store_cur_nalu(p_Cur, p_strm, p_Cur->p_Dec->dxva_ctx));
        pdata += p_strm->nalu_len;
    }
    pkt_impl->length = 0;
    p_strm->nalu_buf = NULL;
    p_strm->startcode_found = 1;

    ret = MPP_OK;
__FAILED:
    return ret;
}